

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Block2Node
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int BlockNum,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Node)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  stringstream local_3a0 [8];
  stringstream temp_1;
  ostream local_390 [376];
  stringstream local_218 [8];
  stringstream temp;
  char *local_90;
  char *p;
  char buf [100];
  int i;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *Node_local;
  int BlockNum_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  Node->NodeState = blocks.buffer[BlockNum].data[0];
  local_90 = blocks.buffer[BlockNum].data + 1;
  buf[0x5c] = '\0';
  buf[0x5d] = '\0';
  buf[0x5e] = '\0';
  buf[0x5f] = '\0';
  unique0x100002d1 = Node;
  for (; (int)buf._92_4_ < this->N + -1; buf._92_4_ = buf._92_4_ + 1) {
    std::__cxx11::stringstream::stringstream(local_218);
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&stack0xffffffffffffffe0->v,(long)(int)buf._92_4_);
    *pvVar1 = *local_90;
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&stack0xffffffffffffffe0->v,(long)(int)buf._92_4_);
    if (*pvVar1 == '1') {
      if (this->Data_Type == '2') {
        std::__cxx11::stringstream::stringstream(local_3a0);
        p = *(char **)(local_90 + 1);
        buf._0_8_ = *(undefined8 *)(local_90 + 9);
        buf._8_8_ = *(undefined8 *)(local_90 + 0x11);
        buf._16_8_ = *(undefined8 *)(local_90 + 0x19);
        std::operator<<(local_390,(char *)&p);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&stack0xffffffffffffffe0->k,(long)(int)buf._92_4_);
        std::operator>>((istream *)local_3a0,(string *)pvVar2);
        std::__cxx11::stringstream::~stringstream(local_3a0);
      }
      else {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&stack0xffffffffffffffe0->k,(long)(int)buf._92_4_);
        *(undefined8 *)pvVar2 = *(undefined8 *)(local_90 + 1);
        *(undefined8 *)(pvVar2 + 8) = *(undefined8 *)(local_90 + 9);
        *(undefined8 *)(pvVar2 + 0x10) = *(undefined8 *)(local_90 + 0x11);
        *(undefined8 *)(pvVar2 + 0x18) = *(undefined8 *)(local_90 + 0x19);
      }
    }
    local_90 = local_90 + 0x21;
    std::__cxx11::stringstream::~stringstream(local_218);
  }
  if (stack0xffffffffffffffe0->NodeState == '1') {
    buf[0x5c] = '\0';
    buf[0x5d] = '\0';
    buf[0x5e] = '\0';
    buf[0x5f] = '\0';
    for (; (int)buf._92_4_ < this->N + -1; buf._92_4_ = buf._92_4_ + 1) {
      pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         (&stack0xffffffffffffffe0->p,(long)(int)buf._92_4_);
      pvVar3->BlockNum = *(int *)local_90;
      local_90 = local_90 + 4;
    }
  }
  buf[0x5c] = '\0';
  buf[0x5d] = '\0';
  buf[0x5e] = '\0';
  buf[0x5f] = '\0';
  for (; (int)buf._92_4_ < this->N; buf._92_4_ = buf._92_4_ + 1) {
    pvVar3 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       (&stack0xffffffffffffffe0->p,(long)(int)buf._92_4_);
    pvVar3->FileOff = *(int *)local_90;
    local_90 = local_90 + 4;
  }
  (stack0xffffffffffffffe0->parent).FileOff = *(int *)local_90;
  return;
}

Assistant:

void BpTree<K>::Block2Node(int BlockNum, IndexNode<K>& Node) {
	int i;
	char buf[100];
	char* p = blocks.buffer[BlockNum].data;
	memcpy(&Node.NodeState, p, sizeof(char));
	p += sizeof(char);
	for (i = 0; i < N - 1; i++) {
		stringstream temp;
		memcpy(&Node.v[i], p, sizeof(char));
		p += sizeof(char);
		if (Node.v[i] == '1') {
			if (this->Data_Type == STRING) {
				stringstream temp;
				memcpy(buf, p, sizeof(string));
				temp << buf;
				temp >> Node.k[i];
			}
			else {
				memcpy(reinterpret_cast<char*>(&Node.k[i]), p, sizeof(K));
			}
		}
		p += sizeof(K);
	}
	if (Node.NodeState == LEAF) {
		for (i = 0; i < N - 1; i++) {
			memcpy(reinterpret_cast<char*>(&Node.p[i].BlockNum), p, sizeof(int));
			p += sizeof(int);
		}
	}
	for (i = 0; i < N; i++) {
		memcpy(reinterpret_cast<char*>(&Node.p[i].FileOff), p, sizeof(int));
		p += sizeof(int);
	}
	memcpy(reinterpret_cast<char*>(&Node.parent.FileOff), p, sizeof(int));
}